

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.h
# Opt level: O2

int sat_solver_add_buffer(sat_solver *pSat,int iVarA,int iVarB,int fCompl)

{
  int iVar1;
  lit Lits [2];
  undefined8 local_28;
  
  if (-1 < (iVarB | iVarA)) {
    local_28 = CONCAT44(iVarB * 2 + 1,iVarA * 2);
    iVar1 = sat_solver_addclause(pSat,(lit *)&local_28,(lit *)&stack0xffffffffffffffe0);
    if (iVar1 != 0) {
      local_28 = CONCAT44(iVarB * 2,iVarA * 2) | 1;
      iVar1 = sat_solver_addclause(pSat,(lit *)&local_28,(lit *)&stack0xffffffffffffffe0);
    }
    return iVar1;
  }
  __assert_fail("iVarA >= 0 && iVarB >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                ,0x13f,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
}

Assistant:

static inline int sat_solver_add_buffer( sat_solver * pSat, int iVarA, int iVarB, int fCompl )
{
    lit Lits[2];
    int Cid;
    assert( iVarA >= 0 && iVarB >= 0 );

    Lits[0] = toLitCond( iVarA, 0 );
    Lits[1] = toLitCond( iVarB, !fCompl );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 2 );
    if ( Cid == 0 )
        return 0;
    assert( Cid );

    Lits[0] = toLitCond( iVarA, 1 );
    Lits[1] = toLitCond( iVarB, fCompl );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 2 );
    if ( Cid == 0 )
        return 0;
    assert( Cid );
    return 2;
}